

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O2

bool __thiscall IceCore::Container::DeleteKeepingOrder(Container *this,udword entry)

{
  uint uVar1;
  udword *puVar2;
  udword i;
  ulong uVar3;
  ulong uVar4;
  udword uVar5;
  
  uVar1 = this->mCurNbEntries;
  puVar2 = this->mEntries;
  uVar3 = 0;
  while( true ) {
    if (uVar1 == uVar3) goto LAB_001a40a5;
    if (puVar2[uVar3] == entry) break;
    uVar3 = uVar3 + 1;
  }
  uVar5 = uVar1 - 1;
  this->mCurNbEntries = uVar5;
  for (uVar4 = uVar3; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    puVar2[uVar4] = puVar2[uVar4 + 1];
    uVar5 = this->mCurNbEntries;
  }
LAB_001a40a5:
  return uVar3 < uVar1;
}

Assistant:

bool Container::DeleteKeepingOrder(udword entry)
{
	// Look for the entry
	for(udword i=0;i<mCurNbEntries;i++)
	{
		if(mEntries[i]==entry)
		{
			// Entry has been found at index i.
			// Shift entries to preserve order. You really should use a linked list instead.
			mCurNbEntries--;
			for(udword j=i;j<mCurNbEntries;j++)
			{
				mEntries[j] = mEntries[j+1];
			}
			return true;
		}
	}
	return false;
}